

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O3

void __thiscall bgui::BaseWindow::BaseWindow(BaseWindow *this,char *title,int w,int h)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  BaseWindowData *pBVar6;
  Display *pDVar7;
  Window WVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  Atom AVar12;
  GC p_Var13;
  undefined8 uVar14;
  XFontStruct *pXVar15;
  XImage *pXVar16;
  char *pcVar17;
  X11Exception *pXVar18;
  long lVar19;
  char *title_local;
  string local_108;
  XTextProperty iconname;
  XTextProperty windowname;
  
  this->_vptr_BaseWindow = (_func_int **)&PTR__BaseWindow_00121bd0;
  title_local = title;
  if ((anonymous_namespace)::initx == '\0') {
    (anonymous_namespace)::initx = '\x01';
    iVar4 = XInitThreads();
    if (iVar4 == 0) {
      pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
      windowname.value = (uchar *)&windowname.format;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&windowname,"Cannot initialize XLib for multi-threading","");
      anon_unknown_0::X11Exception::X11Exception(pXVar18,(string *)&windowname);
      __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,
                  gutil::Exception::~Exception);
    }
  }
  pBVar6 = (BaseWindowData *)operator_new(0xd8);
  memset(pBVar6,0,0xd8);
  (pBVar6->info)._M_dataplus._M_p = (pointer)&(pBVar6->info).field_2;
  (pBVar6->info).field_2._M_local_buf[0] = '\0';
  (pBVar6->text)._M_dataplus._M_p = (pointer)&(pBVar6->text).field_2;
  (pBVar6->text).field_2._M_local_buf[0] = '\0';
  this->p = pBVar6;
  pBVar6->parent = this;
  pDVar7 = (Display *)XOpenDisplay(0);
  pBVar6 = this->p;
  pBVar6->display = pDVar7;
  if (pDVar7 == (Display *)0x0) {
    BaseWindowData::~BaseWindowData(pBVar6);
    operator_delete(pBVar6);
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    windowname.value = (uchar *)&windowname.format;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&windowname,"Cannot connect to X display","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,(string *)&windowname);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  iVar4 = *(int *)(pDVar7 + 0xe0);
  pBVar6->screen = iVar4;
  lVar2 = *(long *)(pDVar7 + 0xe8);
  lVar19 = (long)iVar4 * 0x80;
  iVar4 = *(int *)(lVar2 + 0x18 + lVar19);
  iVar1 = *(int *)(lVar2 + 0x1c + lVar19);
  if (iVar4 < w) {
    w = iVar4;
  }
  pBVar6->w = w;
  if (iVar1 < h) {
    h = iVar1;
  }
  pBVar6->h = h;
  WVar8 = XCreateSimpleWindow(pDVar7,*(undefined8 *)(lVar2 + 0x10 + lVar19),0,0,w,h,0,
                              *(undefined8 *)(lVar2 + 0x60 + lVar19),
                              *(undefined8 *)(lVar2 + 0x58 + lVar19));
  pBVar6 = this->p;
  pBVar6->window = WVar8;
  XSetWindowBackgroundPixmap(pBVar6->display,WVar8,0);
  windowname.value = (uchar *)0x0;
  windowname.encoding = 0;
  windowname.format = 0;
  windowname._20_4_ = 0;
  windowname.nitems = 0;
  iconname.value = (uchar *)0x0;
  iconname.encoding = 0;
  iconname.format = 0;
  iconname._20_4_ = 0;
  iconname.nitems = 0;
  iVar5 = XStringListToTextProperty(&title_local,1);
  if (iVar5 == 0) {
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Allocation for title failed","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,&local_108);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  iVar5 = XStringListToTextProperty(&title_local,1,&iconname);
  if (iVar5 == 0) {
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Allocation for icon name failed","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,&local_108);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  puVar9 = (undefined8 *)XAllocSizeHints();
  puVar10 = (undefined8 *)XAllocWMHints();
  puVar11 = (undefined8 *)XAllocClassHint();
  if (((puVar9 == (undefined8 *)0x0) || (puVar10 == (undefined8 *)0x0)) ||
     (puVar11 == (undefined8 *)0x0)) {
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Allocation failed","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,&local_108);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  *puVar9 = 0x38;
  puVar9[3] = 0xa0000000a;
  *(int *)(puVar9 + 4) = iVar4;
  *(int *)((long)puVar9 + 0x24) = iVar1;
  *puVar10 = 3;
  puVar10[1] = 0x100000001;
  *puVar11 = "bwindow";
  puVar11[1] = title_local;
  XSetWMProperties(this->p->display,this->p->window,&windowname,&iconname,0,0,puVar9,puVar10,puVar11
                  );
  XFree(puVar9);
  XFree(puVar10);
  XFree(puVar11);
  XFree(windowname.value);
  XFree(iconname.value);
  AVar12 = XInternAtom(this->p->display,"WM_DELETE_WINDOW",0);
  pBVar6 = this->p;
  pBVar6->wm_delete_window = AVar12;
  iVar5 = XSetWMProtocols(pBVar6->display,pBVar6->window,&pBVar6->wm_delete_window,1);
  if (iVar5 == 0) {
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    windowname.value = (uchar *)&windowname.format;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&windowname,"Cannot set WM protocol","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,(string *)&windowname);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  pBVar6 = this->p;
  pBVar6->event_mask = 0x2a00d;
  XSelectInput(pBVar6->display,pBVar6->window,0x2a00d);
  p_Var13 = (GC)XCreateGC(this->p->display,this->p->window,0,0);
  pBVar6 = this->p;
  pBVar6->gc = p_Var13;
  XSetBackground(pBVar6->display,p_Var13,
                 *(undefined8 *)
                  (*(long *)(pBVar6->display + 0xe8) + 0x60 + (long)pBVar6->screen * 0x80));
  pBVar6 = this->p;
  XSetForeground(pBVar6->display,pBVar6->gc,
                 *(undefined8 *)
                  (*(long *)(pBVar6->display + 0xe8) + 0x58 + (long)pBVar6->screen * 0x80));
  pDVar7 = this->p->display;
  uVar14 = XGContextFromGC(this->p->gc);
  pXVar15 = (XFontStruct *)XQueryFont(pDVar7,uVar14);
  pBVar6 = this->p;
  pBVar6->font = pXVar15;
  XGetWindowAttributes(pBVar6->display,pBVar6->window,&windowname);
  pXVar16 = (XImage *)
            XCreateImage(this->p->display,windowname.nitems,windowname._20_4_,2,0,0,iVar4,iVar1,8,0)
  ;
  this->p->image = pXVar16;
  bVar3 = gutil::isMSBFirst();
  pBVar6 = this->p;
  pXVar16 = pBVar6->image;
  pXVar16->byte_order = (uint)bVar3;
  pcVar17 = (char *)calloc((long)pXVar16->height * (long)pXVar16->bytes_per_line,1);
  pXVar16->data = pcVar17;
  if (pcVar17 == (char *)0x0) {
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    iconname.value = (uchar *)&iconname.format;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&iconname,"Allocation of image failed","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,(string *)&iconname);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  pBVar6->inotify_fd = 0;
  iVar4 = pthread_mutex_init((pthread_mutex_t *)&pBVar6->mutex,(pthread_mutexattr_t *)0x0);
  if (iVar4 != 0) {
    pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
    windowname.value = (uchar *)&windowname.format;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&windowname,"Cannot initialize mutex","");
    anon_unknown_0::X11Exception::X11Exception(pXVar18,(string *)&windowname);
    __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception)
    ;
  }
  iVar4 = pthread_create(&this->p->thread,(pthread_attr_t *)0x0,anon_unknown_0::eventLoop,this->p);
  if (iVar4 == 0) {
    this->p->running = true;
    return;
  }
  pXVar18 = (X11Exception *)__cxa_allocate_exception(0x28);
  windowname.value = (uchar *)&windowname.format;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&windowname,"Cannot create event thread","");
  anon_unknown_0::X11Exception::X11Exception(pXVar18,(string *)&windowname);
  __cxa_throw(pXVar18,&(anonymous_namespace)::X11Exception::typeinfo,gutil::Exception::~Exception);
}

Assistant:

BaseWindow::BaseWindow(const char *title, int w, int h)
{
  // set multi-threading

  if (!initx)
  {
    initx=true;

    if (XInitThreads() == 0)
    {
      throw X11Exception("Cannot initialize XLib for multi-threading");
    }
  }

  // allocate memory

  p=new BaseWindowData();
  p->parent=this;

  // connect to X server

  p->display=XOpenDisplay(0);

  if (p->display == 0)
  {
    delete p;
    throw X11Exception("Cannot connect to X display");
  }

  // limit window size to display size

  p->screen=DefaultScreen(p->display);
  int maxw=DisplayWidth(p->display, p->screen);
  int maxh=DisplayHeight(p->display, p->screen);

  p->w=w=std::min(w, maxw);
  p->h=h=std::min(h, maxh);

  // create window

  p->window=XCreateSimpleWindow(p->display,
                                RootWindow(p->display, p->screen),
                                0, 0, w, h, 0,
                                BlackPixel(p->display, p->screen),
                                WhitePixel(p->display, p->screen));

  XSetWindowBackgroundPixmap(p->display, p->window, None);

  // set hints

  {
    XSizeHints    *size_hints;
    XWMHints      *wm_hints;
    XClassHint    *class_hints;
    XTextProperty windowname, iconname;

    memset(&windowname, 0, sizeof(XTextProperty));
    memset(&iconname, 0, sizeof(XTextProperty));

    if (XStringListToTextProperty(const_cast<char **>(&title), 1, &windowname) == 0)
    {
      throw X11Exception("Allocation for title failed");
    }

    if (XStringListToTextProperty(const_cast<char **>(&title), 1, &iconname) == 0)
    {
      throw X11Exception("Allocation for icon name failed");
    }

    size_hints=XAllocSizeHints();
    wm_hints=XAllocWMHints();
    class_hints=XAllocClassHint();

    if (size_hints == 0 || wm_hints == 0 || class_hints == 0)
    {
      throw X11Exception("Allocation failed");
    }

    size_hints->flags=PSize | PMinSize | PMaxSize;
    size_hints->min_width=10;
    size_hints->min_height=10;
    size_hints->max_width=maxw;
    size_hints->max_height=maxh;

    wm_hints->flags=StateHint | InputHint;
    wm_hints->initial_state=NormalState;
    wm_hints->input=True;

    class_hints->res_name=const_cast<char *>("bwindow");
    class_hints->res_class=const_cast<char *>(title);

    XSetWMProperties(p->display, p->window, &windowname, &iconname,
                     0, 0, size_hints, wm_hints, class_hints);

    XFree(size_hints);
    XFree(wm_hints);
    XFree(class_hints);
    XFree(windowname.value);
    XFree(iconname.value);
  }

  p->wm_delete_window=XInternAtom(p->display, "WM_DELETE_WINDOW", False);

  if (XSetWMProtocols(p->display, p->window, &(p->wm_delete_window), 1) == 0)
  {
    throw X11Exception("Cannot set WM protocol");
  }

  // set event mask

  p->event_mask=ExposureMask|StructureNotifyMask|ButtonPressMask|
                ButtonReleaseMask|ButtonMotionMask|KeyPressMask;

  XSelectInput(p->display, p->window, p->event_mask);

  // create graphics context

  p->gc=XCreateGC(p->display, p->window, 0, 0);

  XSetBackground(p->display, p->gc, BlackPixel(p->display, p->screen));
  XSetForeground(p->display, p->gc, WhitePixel(p->display, p->screen));

  p->font=XQueryFont(p->display, XGContextFromGC(p->gc));

  // create XImage buffer

  {
    XWindowAttributes wattr;

    XGetWindowAttributes(p->display, p->window, &wattr);

    p->image=XCreateImage(p->display, wattr.visual, wattr.depth, ZPixmap, 0,
                          0, maxw, maxh, 8, 0);

    if (gutil::isMSBFirst())
    {
      p->image->byte_order=MSBFirst;
    }
    else
    {
      p->image->byte_order=LSBFirst;
    }

    if (p->image != 0)
    {
      p->image->data=(char *) calloc(p->image->bytes_per_line*p->image->height, 1);
    }

    if (p->image == 0 || p->image->data == 0)
    {
      throw X11Exception("Allocation of image failed");
    }
  }

#ifdef INCLUDE_INOTIFY
  // initialise inotify pointer

  p->inotify_fd=0;
#endif

  // init mutex and start event loop

  if (pthread_mutex_init(&(p->mutex), 0) != 0)
  {
    throw X11Exception("Cannot initialize mutex");
  }

  if (pthread_create(&(p->thread), 0, eventLoop, p) == 0)
  {
    p->running=true;
  }
  else
  {
    throw X11Exception("Cannot create event thread");
  }
}